

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall vector<Edge>::push_back(vector<Edge> *this,Edge *info)

{
  Edge *pEVar1;
  Edge *pEVar2;
  int iVar3;
  int iVar4;
  size_t in_RDX;
  
  iVar4 = this->_size;
  if (this->_capacity <= iVar4) {
    realloc(this,(void *)(ulong)(uint)(this->_capacity * 2),in_RDX);
    iVar4 = this->_size;
  }
  this->_size = iVar4 + 1;
  pEVar2 = this->vect;
  iVar3 = info->_nodeD;
  pEVar1 = pEVar2 + iVar4;
  pEVar1->_nodeS = info->_nodeS;
  pEVar1->_nodeD = iVar3;
  pEVar2[iVar4]._cost = info->_cost;
  return;
}

Assistant:

inline void push_back(const T &info) {
        if (_size + 1 > _capacity) {
            realloc(_capacity * 2);
        }

        ++_size;
        vect[_size - 1] = info;
    }